

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuMainlistAdd(rbu_file *p)

{
  rbu_vfs *prVar1;
  rbu_file *prVar2;
  rbu_file **pprVar3;
  long lVar4;
  rbu_file **pprVar5;
  
  prVar1 = p->pRbuVfs;
  if (prVar1->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(prVar1->mutex);
  }
  if (p->pRbu == (sqlite3rbu *)0x0) {
    pprVar3 = &prVar1->pMain;
    lVar4 = 0x58;
  }
  else {
    pprVar3 = &prVar1->pMainRbu;
    pprVar5 = pprVar3;
    do {
      prVar2 = *pprVar5;
      if (prVar2 == (rbu_file *)0x0) break;
      pprVar5 = &prVar2->pMainRbuNext;
    } while (prVar2 != p);
    if (prVar2 != (rbu_file *)0x0) goto LAB_001e8684;
    lVar4 = 0x60;
  }
  *(rbu_file **)((long)&(p->base).pMethods + lVar4) = *pprVar3;
  *pprVar3 = p;
LAB_001e8684:
  if (prVar1->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(prVar1->mutex);
    return;
  }
  return;
}

Assistant:

static void rbuMainlistAdd(rbu_file *p){
  rbu_vfs *pRbuVfs = p->pRbuVfs;
  rbu_file *pIter;
  assert( (p->openFlags & SQLITE_OPEN_MAIN_DB) );
  sqlite3_mutex_enter(pRbuVfs->mutex);
  if( p->pRbu==0 ){
    for(pIter=pRbuVfs->pMain; pIter; pIter=pIter->pMainNext);
    p->pMainNext = pRbuVfs->pMain;
    pRbuVfs->pMain = p;
  }else{
    for(pIter=pRbuVfs->pMainRbu; pIter && pIter!=p; pIter=pIter->pMainRbuNext){}
    if( pIter==0 ){
      p->pMainRbuNext = pRbuVfs->pMainRbu;
      pRbuVfs->pMainRbu = p;
    }
  }
  sqlite3_mutex_leave(pRbuVfs->mutex);
}